

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfread.c
# Opt level: O2

FT_Error pcf_get_accel(FT_Stream stream,PCF_Face face,FT_ULong type)

{
  PCF_MetricRec *metric;
  PCF_MetricRec *metric_00;
  FT_Short FVar1;
  FT_Short FVar2;
  FT_Short FVar3;
  FT_Short FVar4;
  FT_Short FVar5;
  undefined4 uVar6;
  int iVar7;
  FT_ULong FVar8;
  FT_Long FVar9;
  ulong uVar10;
  FT_Frame_Field *fields;
  ulong uVar11;
  FT_Error error;
  FT_ULong size;
  int local_4c;
  PCF_MetricRec *local_48;
  FT_ULong local_40;
  FT_ULong local_38;
  
  iVar7 = pcf_seek_to_table_type
                    (stream,(face->toc).tables,(face->toc).count,type,&local_38,&local_40);
  if ((iVar7 == 0) &&
     (local_4c = iVar7, FVar8 = FT_Stream_ReadULongLE(stream,&local_4c), iVar7 = local_4c,
     local_4c == 0)) {
    iVar7 = 0;
    if ((FVar8 & 0xfffffe00) == 0) {
      if ((FVar8 & 4) == 0) {
        fields = pcf_accel_header;
      }
      else {
        fields = pcf_accel_msb_header;
      }
      iVar7 = FT_Stream_ReadFields(stream,fields,&face->accel);
      if (iVar7 == 0) {
        uVar11 = (face->accel).fontAscent;
        uVar10 = -uVar11;
        if (0 < (long)uVar11) {
          uVar10 = uVar11;
        }
        if (0x7fff < uVar10) {
          FVar9 = 0x7fff;
          if ((long)uVar11 < 0) {
            FVar9 = -0x7fff;
          }
          (face->accel).fontAscent = FVar9;
        }
        uVar11 = (face->accel).fontDescent;
        uVar10 = -uVar11;
        if (0 < (long)uVar11) {
          uVar10 = uVar11;
        }
        if (0x7fff < uVar10) {
          FVar9 = 0x7fff;
          if ((long)uVar11 < 0) {
            FVar9 = -0x7fff;
          }
          (face->accel).fontDescent = FVar9;
        }
        uVar11 = FVar8 & 0xffffffff000000ff;
        metric = &(face->accel).minbounds;
        local_4c = iVar7;
        iVar7 = pcf_get_metric(stream,uVar11,metric);
        if (iVar7 == 0) {
          local_48 = &(face->accel).maxbounds;
          local_4c = iVar7;
          iVar7 = pcf_get_metric(stream,uVar11,local_48);
          if (iVar7 == 0) {
            metric_00 = &(face->accel).ink_minbounds;
            if (((uint)FVar8 & 0xffffff00) == 0x100) {
              local_4c = iVar7;
              iVar7 = pcf_get_metric(stream,uVar11,metric_00);
              if (iVar7 == 0) {
                local_4c = iVar7;
                iVar7 = pcf_get_metric(stream,uVar11,&(face->accel).ink_maxbounds);
              }
            }
            else {
              (face->accel).ink_minbounds.bits = (face->accel).minbounds.bits;
              FVar1 = metric->rightSideBearing;
              FVar2 = metric->characterWidth;
              FVar3 = metric->ascent;
              FVar4 = (face->accel).minbounds.descent;
              FVar5 = (face->accel).minbounds.attributes;
              uVar6 = *(undefined4 *)&(face->accel).minbounds.field_0xc;
              metric_00->leftSideBearing = metric->leftSideBearing;
              metric_00->rightSideBearing = FVar1;
              metric_00->characterWidth = FVar2;
              metric_00->ascent = FVar3;
              (face->accel).ink_minbounds.descent = FVar4;
              (face->accel).ink_minbounds.attributes = FVar5;
              *(undefined4 *)&(face->accel).ink_minbounds.field_0xc = uVar6;
              (face->accel).ink_maxbounds.bits = local_48->bits;
              FVar1 = local_48->rightSideBearing;
              FVar2 = local_48->characterWidth;
              FVar3 = local_48->ascent;
              FVar4 = local_48->descent;
              FVar5 = local_48->attributes;
              uVar6 = *(undefined4 *)&local_48->field_0xc;
              (face->accel).ink_maxbounds.leftSideBearing = local_48->leftSideBearing;
              (face->accel).ink_maxbounds.rightSideBearing = FVar1;
              (face->accel).ink_maxbounds.characterWidth = FVar2;
              (face->accel).ink_maxbounds.ascent = FVar3;
              (face->accel).ink_maxbounds.descent = FVar4;
              (face->accel).ink_maxbounds.attributes = FVar5;
              *(undefined4 *)&(face->accel).ink_maxbounds.field_0xc = uVar6;
              iVar7 = 0;
            }
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

static FT_Error
  pcf_get_accel( FT_Stream  stream,
                 PCF_Face   face,
                 FT_ULong   type )
  {
    FT_ULong   format, size;
    FT_Error   error;
    PCF_Accel  accel = &face->accel;


    error = pcf_seek_to_table_type( stream,
                                    face->toc.tables,
                                    face->toc.count,
                                    type,
                                    &format,
                                    &size );
    if ( error )
      goto Bail;

    if ( FT_READ_ULONG_LE( format ) )
      goto Bail;

    FT_TRACE4(( "pcf_get_accel%s:\n"
                "  format: 0x%lX (%s, %s)\n",
                type == PCF_BDF_ACCELERATORS ? " (getting BDF accelerators)"
                                             : "",
                format,
                PCF_BYTE_ORDER( format ) == MSBFirst ? "MSB" : "LSB",
                PCF_FORMAT_MATCH( format, PCF_ACCEL_W_INKBOUNDS ) ?
                  "accelerated" : "not accelerated" ));

    if ( !PCF_FORMAT_MATCH( format, PCF_DEFAULT_FORMAT )    &&
         !PCF_FORMAT_MATCH( format, PCF_ACCEL_W_INKBOUNDS ) )
      goto Bail;

    if ( PCF_BYTE_ORDER( format ) == MSBFirst )
    {
      if ( FT_STREAM_READ_FIELDS( pcf_accel_msb_header, accel ) )
        goto Bail;
    }
    else
    {
      if ( FT_STREAM_READ_FIELDS( pcf_accel_header, accel ) )
        goto Bail;
    }

    FT_TRACE5(( "  noOverlap=%s, constantMetrics=%s,"
                " terminalFont=%s, constantWidth=%s\n"
                "  inkInside=%s, inkMetrics=%s, drawDirection=%s\n"
                "  fontAscent=%ld, fontDescent=%ld, maxOverlap=%ld\n",
                accel->noOverlap ? "yes" : "no",
                accel->constantMetrics ? "yes" : "no",
                accel->terminalFont ? "yes" : "no",
                accel->constantWidth ? "yes" : "no",
                accel->inkInside ? "yes" : "no",
                accel->inkMetrics ? "yes" : "no",
                accel->drawDirection ? "RTL" : "LTR",
                accel->fontAscent,
                accel->fontDescent,
                accel->maxOverlap ));

    /* sanity checks */
    if ( FT_ABS( accel->fontAscent ) > 0x7FFF )
    {
      accel->fontAscent = accel->fontAscent < 0 ? -0x7FFF : 0x7FFF;
      FT_TRACE0(( "pfc_get_accel: clamping font ascent to value %d\n",
                  accel->fontAscent ));
    }
    if ( FT_ABS( accel->fontDescent ) > 0x7FFF )
    {
      accel->fontDescent = accel->fontDescent < 0 ? -0x7FFF : 0x7FFF;
      FT_TRACE0(( "pfc_get_accel: clamping font descent to value %d\n",
                  accel->fontDescent ));
    }

    FT_TRACE5(( "  minbounds:" ));
    error = pcf_get_metric( stream,
                            format & ( ~PCF_FORMAT_MASK ),
                            &(accel->minbounds) );
    if ( error )
      goto Bail;

    FT_TRACE5(( "  maxbounds:" ));
    error = pcf_get_metric( stream,
                            format & ( ~PCF_FORMAT_MASK ),
                            &(accel->maxbounds) );
    if ( error )
      goto Bail;

    if ( PCF_FORMAT_MATCH( format, PCF_ACCEL_W_INKBOUNDS ) )
    {
      FT_TRACE5(( "  ink minbounds:" ));
      error = pcf_get_metric( stream,
                              format & ( ~PCF_FORMAT_MASK ),
                              &(accel->ink_minbounds) );
      if ( error )
        goto Bail;

      FT_TRACE5(( "  ink maxbounds:" ));
      error = pcf_get_metric( stream,
                              format & ( ~PCF_FORMAT_MASK ),
                              &(accel->ink_maxbounds) );
      if ( error )
        goto Bail;
    }
    else
    {
      accel->ink_minbounds = accel->minbounds;
      accel->ink_maxbounds = accel->maxbounds;
    }

  Bail:
    return error;
  }